

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O1

void anon_unknown.dwarf_199ce6::testFile1(char *fileName,bool isImfFile)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char bytes [4];
  ifstream f;
  char local_224 [4];
  long local_220 [2];
  char local_210 [16];
  byte abStack_200 [488];
  
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar2 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::flush();
  std::ifstream::ifstream(local_220);
  std::filebuf::open(local_210,(_Ios_Openmode)fileName);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_220,(long)local_224);
    if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
      bVar1 = Imf_2_5::isImfMagic(local_224);
      if (bVar1 == isImfFile) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"is ",3);
        bVar1 = Imf_2_5::isImfMagic(local_224);
        pcVar3 = "not ";
        if (bVar1) {
          pcVar3 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar3,(ulong)!bVar1 << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"an OpenEXR file\n",0x10);
        std::ifstream::~ifstream(local_220);
        return;
      }
    }
    __assert_fail("!!f && isImfFile == isImfMagic (bytes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMagic.cpp"
                  ,0x48,"void (anonymous namespace)::testFile1(const char *, bool)");
  }
  __assert_fail("!!f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMagic.cpp"
                ,0x43,"void (anonymous namespace)::testFile1(const char *, bool)");
}

Assistant:

void
testFile1 (const char fileName[], bool isImfFile)
{
    cout << fileName << " " << flush;

    ifstream f;
    testutil::OpenStreamWithUTF8Name (f, fileName, ios::in | ios_base::binary);
    assert (!!f);

    char bytes[4];
    f.read (bytes, sizeof (bytes));

    assert (!!f && isImfFile == isImfMagic (bytes));

    cout << "is " << (isImfMagic (bytes)? "": "not ") << "an OpenEXR file\n";
}